

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall ByteData160_BytesConstructor_Test::TestBody(ByteData160_BytesConstructor_Test *this)

{
  pointer puVar1;
  bool bVar2;
  pointer puVar3;
  byte *pbVar4;
  char *pcVar5;
  char *in_R9;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  ByteData160 copy_data;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  Message local_b8;
  string local_b0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  bool local_61;
  undefined1 local_60 [7];
  bool is_equals;
  ByteData160 byte_data;
  size_t i;
  uint8_t byte;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  ByteData160_BytesConstructor_Test *this_local;
  
  target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x14,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  i._3_1_ = 1;
  for (byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar1 = byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,
      puVar3 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28
                                  ), puVar1 < puVar3;
      byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 1) {
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,
                        (size_type)
                        byte_data.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pbVar4 = i._3_1_;
    i._3_1_ = i._3_1_ + 1;
    if (9 < i._3_1_) {
      i._3_1_ = 0;
    }
  }
  cfd::core::ByteData160::ByteData160
            ((ByteData160 *)local_60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  cfd::core::ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,
             (ByteData160 *)local_60);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &gtest_ar.message_,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  local_61 = bVar2;
  cfd::core::ByteData160::GetHex_abi_cxx11_(&local_b0,(ByteData160 *)local_60);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"byte_data.GetHex().c_str()",
             "\"0102030405060708090001020304050607080900\"",pcVar5,
             "0102030405060708090001020304050607080900");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_61,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_d0,
               (AssertionResult *)"is_equals","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string
              ((string *)
               &copy_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  cfd::core::ByteData160::ByteData160((ByteData160 *)&gtest_ar__1.message_,(ByteData160 *)local_60);
  local_129 = cfd::core::ByteData160::operator==
                        ((ByteData160 *)&gtest_ar__1.message_,(ByteData160 *)local_60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_128,(AssertionResult *)"copy_data == byte_data","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_bytedata160.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar__1.message_);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  return;
}

Assistant:

TEST(ByteData160, BytesConstructor) {
  std::vector<uint8_t> target(20);
  uint8_t byte = 1;
  for (size_t i = 0; i < target.size(); i++) {
    target[i] = byte;
    byte++;
    if (byte > 9) {
      byte = 0;
    }
  }
  ByteData160 byte_data = ByteData160(target);
  bool is_equals = (byte_data.GetBytes() == target);

  EXPECT_STREQ(byte_data.GetHex().c_str(),
               "0102030405060708090001020304050607080900");
  EXPECT_TRUE(is_equals);
  auto copy_data = byte_data;
  EXPECT_TRUE(copy_data == byte_data);
}